

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderVectorFields(SwiftGenerator *this,FieldDef *field)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  StructDef *pSVar3;
  SwiftGenerator *pSVar4;
  uint uVar5;
  size_t t;
  mapped_type *pmVar6;
  long *plVar7;
  size_t sVar8;
  undefined8 *puVar9;
  pointer ppFVar10;
  size_type *psVar11;
  ulong *puVar12;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  _Alloc_hider _Var17;
  bool bVar18;
  size_type __dnew;
  size_type __dnew_3;
  size_type __dnew_4;
  string const_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_320;
  key_type local_300;
  string local_2e0;
  SwiftGenerator *local_2c0;
  string local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  pointer local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  Type local_278;
  string local_258;
  string local_238;
  long *local_218;
  long local_210;
  long local_208 [2];
  string local_1f8;
  IdlNamer *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"return o == 0 ? {{CONSTANT}} : ","");
  local_278.base_type = (field->value).type.element;
  local_278.fixed_length = (field->value).type.fixed_length;
  local_278.element = BASE_TYPE_NONE;
  local_278.struct_def._0_4_ = *(undefined4 *)&(field->value).type.struct_def;
  local_278.struct_def._4_4_ = *(undefined4 *)((long)&(field->value).type.struct_def + 4);
  local_278.enum_def._0_4_ = *(undefined4 *)&(field->value).type.enum_def;
  local_278.enum_def._4_4_ = *(undefined4 *)((long)&(field->value).type.enum_def + 4);
  paVar1 = &local_300.field_2;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"SIZE","");
  t = InlineSize(&local_278);
  NumToString<unsigned_long>(&local_320,t);
  this_00 = &this->code_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_300);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  paVar16 = &local_320.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar16) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"HAS_FIELDVAR","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"has","");
  local_1d8 = &this->namer_;
  Namer::Variable<flatbuffers::FieldDef>(&local_320,&local_1d8->super_Namer,&local_2e0,field);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_300);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar16) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,(ulong)(local_2e0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_2e0._M_dataplus._M_p = (pointer)0x39;
  local_320._M_dataplus._M_p = (pointer)paVar16;
  local_320._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2e0);
  local_320.field_2._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
  builtin_strncpy(local_320._M_dataplus._M_p,
                  "let o = {{ACCESS}}.offset({{TABLEOFFSET}}.{{OFFSET}}.v); ",0x39);
  local_320._M_string_length = (size_type)local_2e0._M_dataplus._M_p;
  local_320._M_dataplus._M_p[(long)local_2e0._M_dataplus._M_p] = '\0';
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x37acc8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_300.field_2._M_allocated_capacity = *psVar11;
    local_300.field_2._8_8_ = plVar7[3];
    local_300._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar11;
    local_300._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_300._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_150.field_2._M_allocated_capacity = *psVar11;
    local_150.field_2._8_8_ = plVar7[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar11;
    local_150._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_150._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_2e0._M_dataplus._M_p = (pointer)0x39;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_320._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2e0);
  local_320.field_2._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
  builtin_strncpy(local_320._M_dataplus._M_p,
                  "let o = {{ACCESS}}.offset({{TABLEOFFSET}}.{{OFFSET}}.v); ",0x39);
  local_320._M_string_length = (size_type)local_2e0._M_dataplus._M_p;
  local_320._M_dataplus._M_p[(long)local_2e0._M_dataplus._M_p] = '\0';
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x37ad15);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_300.field_2._M_allocated_capacity = *psVar11;
    local_300.field_2._8_8_ = plVar7[3];
    local_300._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar11;
    local_300._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_300._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170.field_2._8_8_ = plVar7[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar11;
    local_170._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_170._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  paVar16 = &local_320.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar16) {
    operator_delete(local_320._M_dataplus._M_p,(ulong)(local_320.field_2._M_allocated_capacity + 1))
    ;
  }
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"CONSTANT","");
  bVar18 = 0xb < local_278.base_type - BASE_TYPE_UTYPE;
  pcVar14 = "nil";
  if (!bVar18) {
    pcVar14 = "0";
  }
  local_320._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,pcVar14,pcVar14 + (ulong)bVar18 * 2 + 1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_300);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar16) {
    operator_delete(local_320._M_dataplus._M_p,(ulong)(local_320.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_2c0 = this;
  if (local_278.base_type - BASE_TYPE_UTYPE < 0xc) {
    pcVar14 = "?";
    if (CONCAT44(local_278.enum_def._4_4_,local_278.enum_def._0_4_) == 0) {
      pcVar14 = "";
    }
    if (9 < local_278.base_type - BASE_TYPE_UTYPE) {
      pcVar14 = "";
    }
LAB_002eaf4f:
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    sVar8 = strlen(pcVar14);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,pcVar14,pcVar14 + sVar8);
    anon_unknown_1::GenArrayMainBody(&local_320,&local_2e0);
    paVar2 = &local_2b8.field_2;
    local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x39;
    local_2b8._M_dataplus._M_p = (pointer)paVar2;
    local_2b8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8,(ulong)&local_298);
    local_2b8.field_2._M_allocated_capacity = (size_type)local_298;
    builtin_strncpy((char *)((long)local_2b8._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_2b8._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_2b8._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_2b8._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_2b8._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_2b8._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_2b8._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_2b8._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_2b8._M_string_length = (size_type)local_298;
    local_2b8._M_dataplus._M_p[(long)local_298->_M_local_buf] = '\0';
    uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar16) {
      uVar13 = local_320.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_298->_M_local_buf + local_320._M_string_length) {
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != paVar2) {
        paVar16 = local_298;
      }
      if (paVar16 < local_298->_M_local_buf + local_320._M_string_length) goto LAB_002eb036;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_320._M_dataplus._M_p);
    }
    else {
LAB_002eb036:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_2b8._M_dataplus._M_p)
      ;
    }
    puVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_300.field_2._M_allocated_capacity = *puVar12;
      local_300.field_2._8_8_ = puVar9[3];
      local_300._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_300.field_2._M_allocated_capacity = *puVar12;
      local_300._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_300._M_string_length = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)puVar12 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_190.field_2._M_allocated_capacity = *psVar11;
      local_190.field_2._8_8_ = plVar7[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar11;
      local_190._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_190._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar1) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      (ulong)(local_2b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      (ulong)(local_320.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    if (local_278.base_type != BASE_TYPE_UNION) {
      pcVar14 = "?";
      goto LAB_002eaf4f;
    }
    local_2e0._M_dataplus._M_p = (pointer)0x39;
    local_320._M_dataplus._M_p = (pointer)paVar16;
    local_320._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2e0);
    local_320.field_2._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_320._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_320._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_320._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_320._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_320._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_320._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_320._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_320._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_320._M_string_length = (size_type)local_2e0._M_dataplus._M_p;
    local_320._M_dataplus._M_p[(long)local_2e0._M_dataplus._M_p] = '\0';
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x37ad77);
    puVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_300.field_2._M_allocated_capacity = *puVar12;
      local_300.field_2._8_8_ = puVar9[3];
      local_300._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_300.field_2._M_allocated_capacity = *puVar12;
      local_300._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_300._M_string_length = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1b0.field_2._M_allocated_capacity = *psVar11;
      local_1b0.field_2._8_8_ = plVar7[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar11;
      local_1b0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar1) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      (ulong)(local_320.field_2._M_allocated_capacity + 1));
    }
    pcVar14 = "?";
  }
  paVar16 = &local_320.field_2;
  if (local_278.base_type == BASE_TYPE_BOOL) {
    local_300._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"CONSTANT","");
    bVar18 = (field->value).offset == 0;
    pcVar15 = "true";
    if (bVar18) {
      pcVar15 = "false";
    }
    local_320._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_320,pcVar15,pcVar15 + (ulong)bVar18 + 4);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_300);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar16) {
      operator_delete(local_320._M_dataplus._M_p,
                      (ulong)(local_320.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar1) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    local_300._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"VALUETYPE","");
    local_320._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Bool","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_300);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar16) {
      operator_delete(local_320._M_dataplus._M_p,
                      (ulong)(local_320.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar1) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  uVar5 = local_278.base_type - BASE_TYPE_UTYPE;
  if (CONCAT44(local_278.enum_def._4_4_,local_278.enum_def._0_4_) == 0 || 9 < uVar5) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_218,local_210 + (long)local_218);
    std::__cxx11::string::append((char *)&local_1f8);
    CodeWriter::operator+=(this_00,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_278.base_type - BASE_TYPE_UTYPE;
    if (uVar5 < 0xc) goto LAB_002eb44d;
    if (local_278.base_type == BASE_TYPE_STRING) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }","");
      CodeWriter::operator+=(this_00,&local_110);
      local_50.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_002ebef3;
    }
    else if (local_278.base_type == BASE_TYPE_UNION) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + index * {{SIZE}}) }","");
      CodeWriter::operator+=(this_00,&local_130);
      local_50.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_130._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_002ebef3;
    }
    else {
      if (local_278.base_type != BASE_TYPE_STRUCT) goto LAB_002ebef3;
      bVar18 = ((field->value).type.struct_def)->fixed;
      if (bVar18 != true) {
        if (bVar18 == false) {
          local_300._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,
                     "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * {{SIZE}})","");
          GenConstructor(&local_70,local_2c0,&local_300);
          CodeWriter::operator+=(this_00,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != paVar1) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          pSVar3 = (field->value).type.struct_def;
          for (ppFVar10 = (pSVar3->fields).vec.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppFVar10 !=
              (pSVar3->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
            if ((*ppFVar10)->key == true) {
              GenByKeyFunctions(local_2c0,*ppFVar10);
              break;
            }
          }
        }
        goto LAB_002ebef3;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                 ,"");
      CodeWriter::operator+=(this_00,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_300._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"FIELDMETHOD","");
      paVar16 = &local_320.field_2;
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"mutable","");
      (*(local_1d8->super_Namer)._vptr_Namer[3])(&local_320,local_1d8,&local_2e0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_300);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar16) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar1) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      local_300._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"VALUETYPE","");
      GenType_abi_cxx11_(&local_2e0,local_2c0,&(field->value).type,false);
      paVar2 = &local_2b8.field_2;
      local_2b8.field_2._M_allocated_capacity = 0x656c626174754d5f;
      local_2b8._M_string_length = 8;
      local_2b8.field_2._M_local_buf[8] = '\0';
      uVar13 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        uVar13 = local_2e0.field_2._M_allocated_capacity;
      }
      local_2b8._M_dataplus._M_p = (pointer)paVar2;
      if (((undefined1 *)(local_2e0._M_string_length + 8) < (undefined1 *)0x10) &&
         ((ulong)uVar13 < (undefined1 *)(local_2e0._M_string_length + 8))) {
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_2e0._M_dataplus._M_p);
      }
      else {
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)paVar2);
      }
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_320.field_2._M_allocated_capacity = *psVar11;
        local_320.field_2._8_8_ = puVar9[3];
        local_320._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_320.field_2._M_allocated_capacity = *psVar11;
        local_320._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_320._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)psVar11 = 0;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_300);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar16) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        (ulong)(local_2b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar1) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      local_2b8._M_dataplus._M_p = (pointer)paVar2;
      sVar8 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,pcVar14,pcVar14 + sVar8);
      anon_unknown_1::GenArrayMainBody(&local_2e0,&local_2b8);
      local_238._M_dataplus._M_p = (pointer)0x39;
      local_298 = &local_288;
      local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)&local_238);
      local_288._M_allocated_capacity = (size_type)local_238._M_dataplus._M_p;
      *(char *)((long)local_298 + 0x29) = '.';
      *(char *)((long)local_298 + 0x2a) = '{';
      *(char *)((long)local_298 + 0x2b) = '{';
      *(char *)((long)local_298 + 0x2c) = 'O';
      *(char *)((long)local_298 + 0x2d) = 'F';
      *(char *)((long)local_298 + 0x2e) = 'F';
      *(char *)((long)local_298 + 0x2f) = 'S';
      *(char *)((long)local_298 + 0x30) = 'E';
      *(char *)((long)local_298 + 0x31) = 'T';
      *(char *)((long)local_298 + 0x32) = '}';
      *(char *)((long)local_298 + 0x33) = '}';
      *(char *)((long)local_298 + 0x34) = '.';
      *(char *)((long)local_298 + 0x35) = 'v';
      *(char *)((long)local_298 + 0x36) = ')';
      *(char *)((long)local_298 + 0x37) = ';';
      *(char *)((long)local_298 + 0x38) = ' ';
      *(char *)((long)local_298 + 0x20) = 'E';
      *(char *)((long)local_298 + 0x21) = 'O';
      *(char *)((long)local_298 + 0x22) = 'F';
      *(char *)((long)local_298 + 0x23) = 'F';
      *(char *)((long)local_298 + 0x24) = 'S';
      *(char *)((long)local_298 + 0x25) = 'E';
      *(char *)((long)local_298 + 0x26) = 'T';
      *(char *)((long)local_298 + 0x27) = '}';
      *(char *)((long)local_298 + 0x28) = '}';
      *(char *)((long)local_298 + 0x29) = '.';
      *(char *)((long)local_298 + 0x2a) = '{';
      *(char *)((long)local_298 + 0x2b) = '{';
      *(char *)((long)local_298 + 0x2c) = 'O';
      *(char *)((long)local_298 + 0x2d) = 'F';
      *(char *)((long)local_298 + 0x2e) = 'F';
      *(char *)((long)local_298 + 0x2f) = 'S';
      *(char *)((long)local_298 + 0x10) = '}';
      *(char *)((long)local_298 + 0x11) = '}';
      *(char *)((long)local_298 + 0x12) = '.';
      *(char *)((long)local_298 + 0x13) = 'o';
      *(char *)((long)local_298 + 0x14) = 'f';
      *(char *)((long)local_298 + 0x15) = 'f';
      *(char *)((long)local_298 + 0x16) = 's';
      *(char *)((long)local_298 + 0x17) = 'e';
      *(char *)((long)local_298 + 0x18) = 't';
      *(char *)((long)local_298 + 0x19) = '(';
      *(char *)((long)local_298 + 0x1a) = '{';
      *(char *)((long)local_298 + 0x1b) = '{';
      *(char *)((long)local_298 + 0x1c) = 'T';
      *(char *)((long)local_298 + 0x1d) = 'A';
      *(char *)((long)local_298 + 0x1e) = 'B';
      *(char *)((long)local_298 + 0x1f) = 'L';
      local_298->_M_allocated_capacity = 0x203d206f2074656c;
      *(char *)((long)local_298 + 8) = '{';
      *(char *)((long)local_298 + 9) = '{';
      *(char *)((long)local_298 + 10) = 'A';
      *(char *)((long)local_298 + 0xb) = 'C';
      *(char *)((long)local_298 + 0xc) = 'C';
      *(char *)((long)local_298 + 0xd) = 'E';
      *(char *)((long)local_298 + 0xe) = 'S';
      *(char *)((long)local_298 + 0xf) = 'S';
      local_290 = local_238._M_dataplus._M_p;
      local_298->_M_local_buf[(long)local_238._M_dataplus._M_p] = '\0';
      uVar13 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        uVar13 = local_2e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_238._M_dataplus._M_p + local_2e0._M_string_length) {
        _Var17._M_p = (pointer)0xf;
        if (local_298 != &local_288) {
          _Var17._M_p = local_238._M_dataplus._M_p;
        }
        if (_Var17._M_p < local_238._M_dataplus._M_p + local_2e0._M_string_length)
        goto LAB_002ebc43;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_298,0,(char *)0x0,(ulong)local_2e0._M_dataplus._M_p);
      }
      else {
LAB_002ebc43:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_298);
      }
      pcVar14 = (char *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_320.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_320.field_2._8_8_ = puVar9[3];
        local_320._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_320.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_320._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_320._M_string_length = puVar9[1];
      *puVar9 = pcVar14;
      puVar9[1] = 0;
      *pcVar14 = '\0';
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_218);
      puVar12 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_300.field_2._M_allocated_capacity = *puVar12;
        local_300.field_2._8_8_ = puVar9[3];
        local_300._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_300.field_2._M_allocated_capacity = *puVar12;
        local_300._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_300._M_string_length = puVar9[1];
      *puVar9 = puVar12;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"{{ACCESS}}.vector(at: o) + index * {{SIZE}}","");
      GenConstructor(&local_238,local_2c0,&local_f0);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar1) {
        uVar13 = local_300.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_238._M_string_length + local_300._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          uVar13 = local_238.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_238._M_string_length + local_300._M_string_length)
        goto LAB_002ebd93;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_238,0,(char *)0x0,(ulong)local_300._M_dataplus._M_p);
      }
      else {
LAB_002ebd93:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_300,(ulong)local_238._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_258.field_2._M_allocated_capacity = *psVar11;
        local_258.field_2._8_8_ = puVar9[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar11;
        local_258._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_258._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)psVar11 = 0;
      CodeWriter::operator+=(this_00,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar1) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar16) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,(ulong)(local_288._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
      }
      local_50.field_2._M_allocated_capacity = local_2b8.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_2b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == paVar2) goto LAB_002ebef3;
    }
  }
  else {
LAB_002eb44d:
    bVar18 = CONCAT44(local_278.enum_def._4_4_,local_278.enum_def._0_4_) != 0;
    if ((uVar5 < 10 && bVar18) || ((field->value).type.base_type == BASE_TYPE_BOOL)) {
      if (uVar5 >= 10 || !bVar18) goto LAB_002ebef3;
      local_300._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"BASEVALUE","");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,GenTypeBasic::swift_type[(int)local_278.base_type],
                 (allocator<char> *)&local_2e0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_300);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      pSVar4 = local_2c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar1) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      GenEnumDefaultValue_abi_cxx11_(&local_320,pSVar4,field);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x37af34)
      ;
      puVar12 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_300.field_2._M_allocated_capacity = *puVar12;
        local_300.field_2._8_8_ = puVar9[3];
        local_300._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_300.field_2._M_allocated_capacity = *puVar12;
        local_300._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_300._M_string_length = puVar9[1];
      *puVar9 = puVar12;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1d0.field_2._M_allocated_capacity = *psVar11;
        local_1d0.field_2._8_8_ = plVar7[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar11;
        local_1d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar1) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      local_50.field_2._M_allocated_capacity = local_320.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_320._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p == &local_320.field_2) goto LAB_002ebef3;
    }
    else {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                 ,"");
      CodeWriter::operator+=(this_00,&local_90);
      pSVar4 = local_2c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return {{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }"
                 ,"");
      CodeWriter::operator+=(this_00,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((((pSVar4->super_BaseGenerator).parser_)->opts).mutable_buffer != true) goto LAB_002ebef3;
      GenMutateArray_abi_cxx11_(&local_50,local_2c0);
      CodeWriter::operator+=(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002ebef3;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,(ulong)(local_50.field_2._M_allocated_capacity + 1));
LAB_002ebef3:
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  return;
}

Assistant:

void GenTableReaderVectorFields(const FieldDef &field) {
    std::string const_string = "return o == 0 ? {{CONSTANT}} : ";
    const auto vectortype = field.value.type.VectorType();
    code_.SetValue("SIZE", NumToString(InlineSize(vectortype)));
    code_.SetValue("HAS_FIELDVAR", namer_.Variable("has", field));
    code_ += "{{ACCESS_TYPE}} var {{HAS_FIELDVAR}}: Bool { " + GenOffset() +
             "return o == 0 ? false : true }";
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}Count: Int32 { " + GenOffset() +
             "return o == 0 ? 0 : {{ACCESS}}.vector(count: o) }";
    code_.SetValue("CONSTANT", IsScalar(vectortype.base_type) ? "0" : "nil");
    const auto nullable =
        IsScalar(vectortype.base_type) && !IsEnum(vectortype) ? "" : "?";

    if (vectortype.base_type != BASE_TYPE_UNION) {
      code_ += GenArrayMainBody(nullable) + GenOffset() + "\\";
    } else {
      code_ +=
          "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(at "
          "index: "
          "Int32, type: T.Type) -> T? { " +
          GenOffset() + "\\";
    }

    if (IsBool(vectortype.base_type)) {
      code_.SetValue("CONSTANT", field.value.offset == 0 ? "false" : "true");
      code_.SetValue("VALUETYPE", "Bool");
    }

    if (!IsEnum(vectortype)) code_ += const_string + "\\";

    if (IsScalar(vectortype.base_type) && !IsEnum(vectortype) &&
        !IsBool(field.value.type.base_type)) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_ +=
          "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return "
          "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }";
      if (parser_.opts.mutable_buffer) code_ += GenMutateArray();
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        field.value.type.struct_def->fixed) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_.SetValue("FIELDMETHOD", namer_.Method("mutable", field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_ += GenArrayMainBody(nullable) + GenOffset() + const_string +
               GenConstructor("{{ACCESS}}.vector(at: o) + index * {{SIZE}}");

      return;
    }

    if (IsString(vectortype)) {
      code_ +=
          "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (IsEnum(vectortype)) {
      code_.SetValue("BASEVALUE", GenTypeBasic(vectortype, false));
      code_ += "return o == 0 ? {{VALUETYPE}}" + GenEnumDefaultValue(field) +
               " : {{VALUETYPE}}(rawValue: {{ACCESS}}.directRead(of: "
               "{{BASEVALUE}}.self, offset: {{ACCESS}}.vector(at: o) + "
               "index * {{SIZE}})) }";
      return;
    }
    if (vectortype.base_type == BASE_TYPE_UNION) {
      code_ +=
          "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        !field.value.type.struct_def->fixed) {
      code_ += GenConstructor(
          "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * "
          "{{SIZE}})");
      const auto &sd = *field.value.type.struct_def;
      const auto &fields = sd.fields.vec;
      for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
        const auto &key_field = **kit;
        if (key_field.key) {
          GenByKeyFunctions(key_field);
          break;
        }
      }
    }
  }